

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signed-interest.c
# Opt level: O3

int ndn_signed_interest_digest_verify(ndn_interest_t *interest)

{
  byte bVar1;
  uint32_t input_size;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint8_t uVar8;
  uint uVar9;
  byte bVar10;
  ndn_interest_t *component;
  uint8_t local_2e8 [680];
  undefined1 local_40 [8];
  ndn_encoder_t temp_encoder;
  
  bVar10 = interest->flags;
  if (-1 < (char)bVar10) {
    return -0x11;
  }
  bVar1 = (interest->name).components_size;
  if ((interest->name).components[(ulong)bVar1 - 1].type != 2) {
    return -0x11;
  }
  memset(local_2e8,0,0x2a8);
  temp_encoder.output_value = (uint8_t *)0x2a8;
  uVar9 = 0;
  local_40 = (undefined1  [8])local_2e8;
  if (1 < bVar1) {
    uVar9 = 1;
    component = interest;
    do {
      iVar2 = name_component_tlv_encode((ndn_encoder_t *)local_40,(name_component_t *)component);
      if (iVar2 != 0) {
        return iVar2;
      }
      uVar3 = uVar9 & 0xff;
      component = (ndn_interest_t *)((component->name).components + 1);
      uVar9 = uVar3 + 1;
    } while ((int)uVar3 < (int)((interest->name).components_size - 1));
    bVar10 = interest->flags;
    uVar9 = temp_encoder.output_value._4_4_;
  }
  if ((bVar10 & 0x40) != 0) {
    if ((uint)temp_encoder.output_value == uVar9) {
      return -0xe;
    }
    *(uint8_t *)((long)local_40 + (ulong)uVar9) = '$';
    uVar6 = temp_encoder.output_value._4_4_ + 1;
    uVar3 = (interest->parameters).size;
    iVar2 = 1;
    uVar5 = uVar6;
    if (0xfc < uVar3 || (uint)temp_encoder.output_value == uVar6) {
      if (uVar3 < 0x10000 && 2 < (uint)temp_encoder.output_value - uVar6) {
        iVar2 = 3;
        iVar4 = 2;
        iVar7 = 1;
        uVar8 = 0xfd;
      }
      else {
        if ((uint)temp_encoder.output_value - uVar6 < 5) {
          return -0xe;
        }
        *(uint8_t *)((long)local_40 + (ulong)uVar6) = 0xfe;
        *(uint8_t *)((long)local_40 + (ulong)(temp_encoder.output_value._4_4_ + 2)) =
             (uint8_t)(uVar3 >> 0x18);
        uVar8 = (uint8_t)(uVar3 >> 0x10);
        uVar5 = temp_encoder.output_value._4_4_ + 3;
        iVar2 = 5;
        iVar4 = 4;
        iVar7 = 3;
      }
      *(uint8_t *)((long)local_40 + (ulong)uVar5) = uVar8;
      *(uint8_t *)((long)local_40 + (ulong)(iVar7 + uVar6)) = (uint8_t)(uVar3 >> 8);
      uVar5 = iVar4 + uVar6;
    }
    *(uint8_t *)((long)local_40 + (ulong)uVar5) = (uint8_t)uVar3;
    uVar6 = iVar2 + uVar6;
    temp_encoder.output_value = (uint8_t *)CONCAT44(uVar6,(uint)temp_encoder.output_value);
    uVar3 = (interest->parameters).size;
    if ((int)((uint)temp_encoder.output_value - uVar6) < (int)uVar3) {
      return -10;
    }
    memcpy((uint8_t *)((long)local_40 + (ulong)uVar6),&interest->parameters,(ulong)uVar3);
    temp_encoder.output_value =
         (uint8_t *)
         CONCAT44(temp_encoder.output_value._4_4_ + uVar3,(uint)temp_encoder.output_value);
  }
  uVar3 = ndn_signature_info_tlv_encode((ndn_encoder_t *)local_40,&interest->signature);
  if (uVar3 == 0) {
    input_size = temp_encoder.output_value._4_4_;
    uVar3 = ndn_signature_value_tlv_encode((ndn_encoder_t *)local_40,&interest->signature);
    if ((uVar3 == 0) &&
       (uVar3 = ndn_sha256_verify((uint8_t *)local_40,input_size,(interest->signature).sig_value,
                                  (interest->signature).sig_size), -1 < (int)uVar3)) {
      bVar10 = (interest->name).components_size;
      iVar2 = ndn_sha256_verify((uint8_t *)((long)local_40 + (ulong)uVar9),
                                temp_encoder.output_value._4_4_ - uVar9,
                                (interest->name).components[(ulong)bVar10 - 1].value,
                                (uint)(interest->name).components[(ulong)bVar10 - 1].size);
      uVar3 = iVar2 >> 0x1f & 0xffffffe2;
    }
  }
  return uVar3;
}

Assistant:

int
ndn_signed_interest_digest_verify(const ndn_interest_t* interest)
{
  // check the signed Interest format
  if (!ndn_interest_is_signed(interest) ||
      interest->name.components[interest->name.components_size - 1].type != TLV_ParametersSha256DigestComponent) {
    return NDN_UNSUPPORTED_FORMAT;
  }
  int ret_val = -1;
  uint8_t be_signed[NDN_SIGNED_INTEREST_BE_SIGNED_MAX_SIZE] = {0};
  ndn_encoder_t temp_encoder;
  encoder_init(&temp_encoder, be_signed, NDN_SIGNED_INTEREST_BE_SIGNED_MAX_SIZE);

  // the signing input starts at Name's Value (V)
  for (uint8_t i = 0; i < interest->name.components_size - 1; i++) {
    ret_val = name_component_tlv_encode(&temp_encoder, &interest->name.components[i]);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  // the digest input starts at parameters
  uint32_t param_block_starting = temp_encoder.offset;
  if (ndn_interest_has_Parameters(interest)) {
    ret_val = encoder_append_type(&temp_encoder, TLV_ApplicationParameters);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(&temp_encoder, interest->parameters.size);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_raw_buffer_value(&temp_encoder, interest->parameters.value, interest->parameters.size);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  ret_val = ndn_signature_info_tlv_encode(&temp_encoder, &interest->signature);
  if (ret_val != NDN_SUCCESS) return ret_val;
  // the signing input ends at signature info
  uint32_t siginfo_block_ending = temp_encoder.offset;
  ret_val = ndn_signature_value_tlv_encode(&temp_encoder, &interest->signature);
  if (ret_val != NDN_SUCCESS) return ret_val;

  int result = ndn_sha256_verify(temp_encoder.output_value, siginfo_block_ending,
                                 interest->signature.sig_value, interest->signature.sig_size);

  if (result < 0)
    return result;

  result = ndn_sha256_verify(&temp_encoder.output_value[param_block_starting],
                             temp_encoder.offset - param_block_starting,
                             interest->name.components[interest->name.components_size - 1].value,
                             interest->name.components[interest->name.components_size - 1].size);
  if (result < 0)
    return NDN_SEC_SIGNED_INTEREST_INVALID_DIGEST;
  return NDN_SUCCESS;
}